

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserException.cpp
# Opt level: O1

void __thiscall
ninx::parser::exception::ParserException::ParserException
          (ParserException *this,int line,string *origin,string *message)

{
  string local_40;
  
  make_message(&local_40,line,origin,message);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)this = &PTR__runtime_error_0014ff18;
  this->line = line;
  this->origin = origin;
  return;
}

Assistant:

ninx::parser::exception::ParserException::ParserException(int line, std::string &origin, const std::string &message)
        : runtime_error(
        make_message(line, origin, message)), line{line}, origin(origin) {

}